

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.h
# Opt level: O2

void __thiscall brotli::RingBuffer::Write(RingBuffer *this,uint8_t *bytes,size_t n)

{
  uint uVar1;
  long lVar2;
  size_t __n;
  ulong __n_00;
  uint uVar3;
  uint8_t *__dest;
  ulong uVar4;
  
  uVar4 = (ulong)(this->mask_ & this->pos_);
  WriteTail(this,bytes,n);
  __dest = this->buffer_ + uVar4;
  __n = n;
  if ((ulong)this->size_ < uVar4 + n) {
    __n_00 = (this->size_ + this->tail_size_) - uVar4;
    if (n <= __n_00) {
      __n_00 = n;
    }
    memcpy(__dest,bytes,__n_00);
    __dest = this->buffer_;
    lVar2 = this->size_ - uVar4;
    bytes = bytes + lVar2;
    __n = n - lVar2;
  }
  memcpy(__dest,bytes,__n);
  this->buffer_[-2] = this->buffer_[this->size_ - 2];
  this->buffer_[-1] = this->buffer_[this->size_ - 1];
  uVar3 = (int)n + this->pos_;
  uVar1 = uVar3 & 0x3fffffff | 0x40000000;
  if (uVar3 < 0x40000001) {
    uVar1 = uVar3;
  }
  this->pos_ = uVar1;
  return;
}

Assistant:

void Write(const uint8_t *bytes, size_t n) {
    const size_t masked_pos = pos_ & mask_;
    // The length of the writes is limited so that we do not need to worry
    // about a write
    WriteTail(bytes, n);
    if (PREDICT_TRUE(masked_pos + n <= size_)) {
      // A single write fits.
      memcpy(&buffer_[masked_pos], bytes, n);
    } else {
      // Split into two writes.
      // Copy into the end of the buffer, including the tail buffer.
      memcpy(&buffer_[masked_pos], bytes,
             std::min(n, (size_ + tail_size_) - masked_pos));
      // Copy into the beginning of the buffer
      memcpy(&buffer_[0], bytes + (size_ - masked_pos),
             n - (size_ - masked_pos));
    }
    buffer_[-2] = buffer_[size_ - 2];
    buffer_[-1] = buffer_[size_ - 1];
    pos_ += static_cast<uint32_t>(n);
    if (pos_ > (1u << 30)) {  /* Wrap, but preserve not-a-first-lap feature. */
      pos_ = (pos_ & ((1u << 30) - 1)) | (1u << 30);
    }
  }